

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall
sptk::reaper::EpochTracker::Window
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,int32_t offset,
          size_t size,float *output)

{
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  ulong in_RCX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t i_1;
  float *data;
  size_t i;
  float arg;
  undefined4 in_stack_ffffffffffffffa0;
  value_type vVar7;
  float in_stack_ffffffffffffffa4;
  size_type in_stack_ffffffffffffffb8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc0;
  size_type local_38;
  
  sVar1 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x110));
  if (in_RCX != sVar1) {
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    auVar6._8_4_ = (int)(in_RCX >> 0x20);
    auVar6._0_8_ = in_RCX;
    auVar6._12_4_ = 0x45300000;
    for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
      auVar5._8_4_ = (int)(local_38 >> 0x20);
      auVar5._0_8_ = local_38;
      auVar5._12_4_ = 0x45300000;
      dVar4 = cos(((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0) + 0.5) *
                  (double)(float)(6.283185307179586 /
                                 ((auVar6._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)in_RCX) - 4503599627370496.0))));
      in_stack_ffffffffffffffa4 = (float)(dVar4 * -0.5 + 0.5);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x110),local_38);
      *pvVar2 = in_stack_ffffffffffffffa4;
    }
  }
  pvVar3 = std::vector<float,_std::allocator<float>_>::front
                     ((vector<float,_std::allocator<float>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pvVar3 = pvVar3 + in_EDX;
  for (sVar1 = 0; sVar1 < in_RCX; sVar1 = sVar1 + 1) {
    vVar7 = pvVar3[sVar1];
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x110),sVar1);
    *(float *)(in_R8 + sVar1 * 4) = vVar7 * *pvVar2;
  }
  return;
}

Assistant:

void EpochTracker::Window(const std::vector<float>& input, int32_t offset, size_t size,
                          float* output) {
  if (size != window_.size()) {
    window_.resize(size);
    float arg = 2.0 * M_PI / size;
    for (size_t i = 0; i < size; ++i) {
      window_[i] = 0.5 - (0.5 * cos((i + 0.5) * arg));
    }
  }
  const float* data = (&(input.front())) + offset;
  for (size_t i = 0; i < size; ++i) {
    output[i] = data[i] * window_[i];
  }
}